

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

void __thiscall
TTD::TextFormatWriter::WriteNakedDouble(TextFormatWriter *this,double val,Separator separator)

{
  undefined1 auVar1 [16];
  bool bVar2;
  BOOL BVar3;
  undefined7 in_register_00000031;
  char16_t *buff;
  undefined1 auVar4 [16];
  size_t sStack_20;
  
  (*(this->super_FileWriter)._vptr_FileWriter[2])(this,CONCAT71(in_register_00000031,separator));
  BVar3 = Js::JavascriptNumber::IsNan(val);
  if (BVar3 == 0) {
    bVar2 = Js::JavascriptNumber::IsPosInf(val);
    if (bVar2) {
      buff = L"#+inf";
    }
    else {
      bVar2 = Js::JavascriptNumber::IsNegInf(val);
      if (!bVar2) {
        if ((val != 1.79769313486232e+308) || (NAN(val))) {
          if ((val != 4.94065645841247e-324) || (NAN(val))) {
            if ((val != 2.220446049250313e-16) || (NAN(val))) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = val;
              if (val == 2147483647.0) {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = val;
                auVar4 = roundsd(auVar4,auVar1,9);
                if ((auVar4._0_8_ == val) && (!NAN(auVar4._0_8_) && !NAN(val))) {
                  FileWriter::WriteFormattedCharData<6ul,long>
                            (&this->super_FileWriter,(char16 (*) [6])0xf2863c,0x7fffffff);
                  return;
                }
              }
              FileWriter::WriteFormattedCharData<6ul,double>
                        (&this->super_FileWriter,(char16 (*) [6])L"%.32f",val);
              return;
            }
            buff = L"#ep";
          }
          else {
            buff = L"#lb";
          }
        }
        else {
          buff = L"#ub";
        }
        sStack_20 = 6;
        goto LAB_00838139;
      }
      buff = L"#-inf";
    }
    sStack_20 = 10;
  }
  else {
    buff = L"#nan";
    sStack_20 = 8;
  }
LAB_00838139:
  FileWriter::WriteRawByteBuff(&this->super_FileWriter,(byte *)buff,sStack_20);
  return;
}

Assistant:

void TextFormatWriter::WriteNakedDouble(double val, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        if(Js::JavascriptNumber::IsNan(val))
        {
            this->WriteRawCharBuff(_u("#nan"), 4);
        }
        else if(Js::JavascriptNumber::IsPosInf(val))
        {
            this->WriteRawCharBuff(_u("#+inf"), 5);
        }
        else if(Js::JavascriptNumber::IsNegInf(val))
        {
            this->WriteRawCharBuff(_u("#-inf"), 5);
        }
        else if(Js::JavascriptNumber::MAX_VALUE == val)
        {
            this->WriteRawCharBuff(_u("#ub"), 3);
        }
        else if(Js::JavascriptNumber::MIN_VALUE == val)
        {
            this->WriteRawCharBuff(_u("#lb"), 3);
        }
        else if(Js::Math::EPSILON == val)
        {
            this->WriteRawCharBuff(_u("#ep"), 3);
        }
        else
        {
            if(INT32_MAX <= val && val <= INT32_MAX && floor(val) == val)
            {
                this->WriteFormattedCharData(_u("%I64i"), (int64)val);
            }
            else
            {
                //
                //TODO: this is nice for visual debugging but we inherently lose precision
                //      will want to change this to a dump of the bit representation of the number
                //

                this->WriteFormattedCharData(_u("%.32f"), val);
            }
        }
    }